

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfskmsgbmscreen.cpp
# Opt level: O0

void __thiscall QEglFSKmsGbmScreen::updateFlipStatus(QEglFSKmsGbmScreen *this)

{
  bool bVar1;
  const_iterator o;
  CloneDestination *pCVar2;
  QList<QEglFSKmsGbmScreen::CloneDestination> *in_RDI;
  long in_FS_OFFSET;
  CloneDestination *d;
  add_const_t<QList<QEglFSKmsGbmScreen::CloneDestination>_> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI[0x19].d.size == 0) && (((ulong)in_RDI[0x18].d.ptr & 1) == 0)) {
    local_10.i = (CloneDestination *)0xaaaaaaaaaaaaaaaa;
    local_10 = QList<QEglFSKmsGbmScreen::CloneDestination>::begin(in_RDI);
    o = QList<QEglFSKmsGbmScreen::CloneDestination>::end(in_RDI);
    while (bVar1 = QList<QEglFSKmsGbmScreen::CloneDestination>::const_iterator::operator!=
                             (&local_10,o), bVar1) {
      pCVar2 = QList<QEglFSKmsGbmScreen::CloneDestination>::const_iterator::operator*(&local_10);
      if ((pCVar2->cloneFlipPending & 1U) != 0) goto LAB_0011d389;
      QList<QEglFSKmsGbmScreen::CloneDestination>::const_iterator::operator++(&local_10);
    }
    if (in_RDI[0x17].d.size != 0) {
      gbm_surface_release_buffer(in_RDI[0x17].d.ptr,in_RDI[0x17].d.size);
    }
    in_RDI[0x17].d.size = (qsizetype)in_RDI[0x18].d.d;
    in_RDI[0x18].d.d = (Data *)0x0;
  }
LAB_0011d389:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QEglFSKmsGbmScreen::updateFlipStatus()
{
    // only for 'real' outputs that own the color buffer, i.e. that are not cloning another one
    if (m_cloneSource)
        return;

    // proceed only if flips for both this and all others that clone this have finished
    if (m_flipPending)
        return;

    for (const CloneDestination &d : std::as_const(m_cloneDests)) {
        if (d.cloneFlipPending)
            return;
    }

    if (m_gbm_bo_current) {
        gbm_surface_release_buffer(m_gbm_surface,
                                   m_gbm_bo_current);
    }

    m_gbm_bo_current = m_gbm_bo_next;
    m_gbm_bo_next = nullptr;
}